

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::FixupOutPolygon(Clipper *this,OutRec *outRec)

{
  OutPt **ppOVar1;
  bool bVar2;
  OutPt *pOVar3;
  OutPt *tmp;
  OutPt *local_28;
  OutPt *pp;
  OutPt *lastOK;
  OutRec *outRec_local;
  Clipper *this_local;
  
  pp = (OutPt *)0x0;
  outRec->pts = outRec->bottomPt;
  local_28 = outRec->bottomPt;
  lastOK = (OutPt *)outRec;
  outRec_local = (OutRec *)this;
  while ((local_28->prev != local_28 && (local_28->prev != local_28->next))) {
    bVar2 = PointsEqual(&local_28->pt,&local_28->next->pt);
    if ((bVar2) ||
       (bVar2 = SlopesEqual(local_28->prev->pt,local_28->pt,local_28->next->pt,
                            (bool)((byte)(this->_vptr_Clipper[-3] + 0x10)
                                         [(long)&(this->m_PolyOuts).
                                                 super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                         ] & 1)), bVar2)) {
      pOVar3 = local_28;
      pp = (OutPt *)0x0;
      if (local_28 == lastOK->prev) {
        lastOK->prev = (OutPt *)0x0;
      }
      local_28->prev->next = local_28->next;
      local_28->next->prev = local_28->prev;
      ppOVar1 = &local_28->prev;
      bVar2 = local_28 != (OutPt *)0x0;
      local_28 = *ppOVar1;
      if (bVar2) {
        operator_delete(pOVar3);
      }
    }
    else {
      if (local_28 == pp) {
        if (lastOK->prev != (OutPt *)0x0) {
          return;
        }
        pOVar3 = GetBottomPt(local_28);
        lastOK->prev = pOVar3;
        lastOK->prev->idx = lastOK->idx;
        lastOK->next = lastOK->prev;
        return;
      }
      if (pp == (OutPt *)0x0) {
        pp = local_28;
      }
      local_28 = local_28->next;
    }
  }
  DisposeOutPts(&local_28);
  lastOK->next = (OutPt *)0x0;
  lastOK->prev = (OutPt *)0x0;
  return;
}

Assistant:

void Clipper::FixupOutPolygon(OutRec &outRec)
{
  //FixupOutPolygon() - removes duplicate points and simplifies consecutive
  //parallel edges by removing the middle vertex.
  OutPt *lastOK = 0;
  outRec.pts = outRec.bottomPt;
  OutPt *pp = outRec.bottomPt;

  for (;;)
  {
    if (pp->prev == pp || pp->prev == pp->next )
    {
      DisposeOutPts(pp);
      outRec.pts = 0;
      outRec.bottomPt = 0;
      return;
    }
    //test for duplicate points and for same slope (cross-product) ...
    if ( PointsEqual(pp->pt, pp->next->pt) ||
      SlopesEqual(pp->prev->pt, pp->pt, pp->next->pt, m_UseFullRange) )
    {
      lastOK = 0;
      OutPt *tmp = pp;
      if (pp == outRec.bottomPt)
        outRec.bottomPt = 0; //flags need for updating
      pp->prev->next = pp->next;
      pp->next->prev = pp->prev;
      pp = pp->prev;
      delete tmp;
    }
    else if (pp == lastOK) break;
    else
    {
      if (!lastOK) lastOK = pp;
      pp = pp->next;
    }
  }
  if (!outRec.bottomPt) {
    outRec.bottomPt = GetBottomPt(pp);
    outRec.bottomPt->idx = outRec.idx;
    outRec.pts = outRec.bottomPt;
  }
}